

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionController::SetAssetIssuance
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,Amount *asset_amount,
          Script *asset_locking_script,ByteData *asset_nonce,Amount *token_amount,
          Script *token_locking_script,ByteData *token_nonce,bool is_blind,
          ByteData256 *contract_hash,bool is_random_sort,bool is_remove_nonce)

{
  uint32_t in_ECX;
  Txid *in_RDX;
  long in_RSI;
  IssuanceParameter *in_RDI;
  Amount *in_R8;
  Script *in_R9;
  ByteData *in_stack_00000008;
  IssuanceParameter *in_stack_00000010;
  IssuanceParameter *in_stack_00000018;
  ByteData *in_stack_00000020;
  byte in_stack_00000028;
  ByteData256 *in_stack_00000030;
  byte in_stack_00000038;
  byte in_stack_00000040;
  ConfidentialNonce confidential_token_nonce;
  ConfidentialNonce confidential_asset_nonce;
  uint32_t txin_index;
  IssuanceParameter *param;
  undefined4 in_stack_fffffffffffffe70;
  IssuanceParameter local_168;
  undefined1 local_f1;
  ConfidentialNonce local_f0;
  ConfidentialNonce local_c8;
  ConfidentialNonce local_90;
  ConfidentialNonce local_68;
  uint32_t local_40;
  byte local_3b;
  byte local_3a;
  byte local_39;
  Script *local_38;
  Amount *local_30;
  
  local_39 = in_stack_00000028 & 1;
  local_3a = in_stack_00000038 & 1;
  local_3b = in_stack_00000040 & 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_40 = core::ConfidentialTransaction::GetTxInIndex
                       ((ConfidentialTransaction *)(in_RSI + 0x10),in_RDX,in_ECX);
  core::ConfidentialNonce::ConfidentialNonce(&local_68);
  core::ConfidentialNonce::ConfidentialNonce(&local_90);
  if ((local_3b & 1) == 0) {
    core::ConfidentialNonce::ConfidentialNonce(&local_c8,in_stack_00000008);
    core::ConfidentialNonce::operator=(&local_68,&local_c8);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x586877);
    core::ConfidentialNonce::ConfidentialNonce(&local_f0,in_stack_00000020);
    core::ConfidentialNonce::operator=(&local_90,&local_f0);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5868b2);
  }
  local_f1 = 0;
  core::IssuanceParameter::IssuanceParameter
            ((IssuanceParameter *)CONCAT44(in_ECX,in_stack_fffffffffffffe70));
  core::ConfidentialTransaction::SetAssetIssuance
            (&local_168,(ConfidentialTransaction *)(in_RSI + 0x10),local_40,local_30,local_38,
             &local_68,(Amount *)in_stack_00000010,(Script *)in_stack_00000018,&local_90,
             (bool)(local_39 & 1),in_stack_00000030);
  core::IssuanceParameter::operator=(in_stack_00000018,in_stack_00000010);
  core::IssuanceParameter::~IssuanceParameter(in_stack_00000018);
  if ((local_3a & 1) != 0) {
    RandomSortTxOut((ConfidentialTransactionController *)0x5869ec);
  }
  local_f1 = 1;
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x586a4f);
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x586a5c);
  return in_RDI;
}

Assistant:

IssuanceParameter ConfidentialTransactionController::SetAssetIssuance(
    const Txid& txid, uint32_t vout, const Amount& asset_amount,
    const Script& asset_locking_script, const ByteData& asset_nonce,
    const Amount& token_amount, const Script& token_locking_script,
    const ByteData& token_nonce, bool is_blind,
    const ByteData256& contract_hash, bool is_random_sort,
    bool is_remove_nonce) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);

  ConfidentialNonce confidential_asset_nonce;
  ConfidentialNonce confidential_token_nonce;
  if (!is_remove_nonce) {
    confidential_asset_nonce = ConfidentialNonce(asset_nonce);
    confidential_token_nonce = ConfidentialNonce(token_nonce);
  }

  IssuanceParameter param;
  param = transaction_.SetAssetIssuance(
      txin_index, asset_amount, asset_locking_script, confidential_asset_nonce,
      token_amount, token_locking_script, confidential_token_nonce, is_blind,
      contract_hash);
  if (is_random_sort) {
    RandomSortTxOut();
  }
  return param;
}